

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
::~List_column(List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
               *this)

{
  Column_support *pCVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _Node *__tmp;
  _List_node_base *p_Var5;
  
  pCVar1 = &this->column_;
  p_Var5 = (this->column_).
           super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)pCVar1) {
    do {
      p_Var2 = p_Var5[1]._M_next;
      if ((((this->super_Row_access_option).rows_ != (Row_container *)0x0) ||
          (p_Var2 != (_List_node_base *)0x0)) &&
         (p_Var3 = p_Var2->_M_prev, p_Var3 != (_List_node_base *)0x0)) {
        p_Var4 = p_Var2[1]._M_next;
        p_Var4->_M_next = p_Var3;
        p_Var3->_M_prev = p_Var4;
      }
      operator_delete(p_Var2,0x20);
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)pCVar1);
    p_Var5 = (pCVar1->
             super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  }
  while (p_Var5 != (_List_node_base *)pCVar1) {
    p_Var2 = p_Var5->_M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var2;
  }
  return;
}

Assistant:

inline List_column<Master_matrix>::~List_column()
{
  for (auto* entry : column_) {
    if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::unlink(entry);
    entryPool_->destroy(entry);
  }
}